

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

void __thiscall MetaCommand::ListOptionsSimplified(MetaCommand *this)

{
  bool bVar1;
  reference pOVar2;
  ulong uVar3;
  ostream *poVar4;
  char *pcVar5;
  reference pFVar6;
  long in_RDI;
  const_iterator itField;
  const_iterator it;
  vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
  local_28;
  Option *local_20;
  Option *local_18;
  __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
  local_10 [2];
  
  local_18 = (Option *)
             std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::begin
                       ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                        in_stack_ffffffffffffff88);
  __gnu_cxx::
  __normal_iterator<MetaCommand::Option_const*,std::vector<MetaCommand::Option,std::allocator<MetaCommand::Option>>>
  ::__normal_iterator<MetaCommand::Option*>
            ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
              *)in_stack_ffffffffffffff90,
             (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
              *)in_stack_ffffffffffffff88);
  do {
    local_20 = (Option *)
               std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::end
                         ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                          in_stack_ffffffffffffff88);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) {
      if (*(long *)(in_RDI + 0xc0) != 0) {
        (**(code **)(in_RDI + 0xc0))();
      }
      return;
    }
    pOVar2 = __gnu_cxx::
             __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
             ::operator*(local_10);
    if ((pOVar2->required & 1U) == 0) {
      std::operator<<((ostream *)&std::cout,"   [ ");
    }
    else {
      std::operator<<((ostream *)&std::cout,"   ");
    }
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator*(local_10);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"-");
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
      ::operator*(local_10);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::operator<<(poVar4," ");
    }
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator*(local_10);
    local_28._M_current =
         (Field *)std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::begin
                            (in_stack_ffffffffffffff88);
    while( true ) {
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
      ::operator*(local_10);
      std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::end
                (in_stack_ffffffffffffff88);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                          *)in_stack_ffffffffffffff90,
                         (__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                          *)in_stack_ffffffffffffff88);
      if (!bVar1) break;
      pFVar6 = __gnu_cxx::
               __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
               ::operator*(&local_28);
      if (pFVar6->type != FLAG) {
        pFVar6 = __gnu_cxx::
                 __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                 ::operator*(&local_28);
        if ((pFVar6->required & 1U) == 0) {
          std::operator<<((ostream *)&std::cout,"[");
        }
        else {
          std::operator<<((ostream *)&std::cout,"<");
        }
        __gnu_cxx::
        __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
        ::operator*(&local_28);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        std::operator<<((ostream *)&std::cout,pcVar5);
        pFVar6 = __gnu_cxx::
                 __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                 ::operator*(&local_28);
        if ((pFVar6->required & 1U) == 0) {
          std::operator<<((ostream *)&std::cout,"] ");
        }
        else {
          std::operator<<((ostream *)&std::cout,"> ");
        }
      }
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
      ::operator++(&local_28);
    }
    pOVar2 = __gnu_cxx::
             __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
             ::operator*(local_10);
    if ((pOVar2->required & 1U) == 0) {
      std::operator<<((ostream *)&std::cout,"]");
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator*(local_10);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"      = ");
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
      ::operator*(local_10);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::operator<<(poVar4,pcVar5);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
      ::operator*(local_10);
      local_28._M_current =
           (Field *)std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::begin
                              (in_stack_ffffffffffffff88);
      while( true ) {
        __gnu_cxx::
        __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
        ::operator*(local_10);
        std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::end
                  (in_stack_ffffffffffffff88);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                            *)in_stack_ffffffffffffff90,
                           (__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                            *)in_stack_ffffffffffffff88);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
        ::operator*(&local_28);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
LAB_001293fb:
          poVar4 = std::operator<<((ostream *)&std::cout,"        With: ");
          __gnu_cxx::
          __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
          ::operator*(&local_28);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          std::operator<<(poVar4,pcVar5);
          __gnu_cxx::
          __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
          ::operator*(&local_28);
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) {
            poVar4 = std::operator<<((ostream *)&std::cout," = ");
            __gnu_cxx::
            __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
            ::operator*(&local_28);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            std::operator<<(poVar4,pcVar5);
          }
          __gnu_cxx::
          __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
          ::operator*(&local_28);
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) {
            in_stack_ffffffffffffff90 = std::operator<<((ostream *)&std::cout," (Default = ");
            pFVar6 = __gnu_cxx::
                     __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                     ::operator*(&local_28);
            poVar4 = std::operator<<(in_stack_ffffffffffffff90,(string *)&pFVar6->value);
            std::operator<<(poVar4,")");
          }
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        }
        else {
          __gnu_cxx::
          __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
          ::operator*(&local_28);
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) goto LAB_001293fb;
        }
        __gnu_cxx::
        __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
        ::operator++(&local_28);
      }
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator++(local_10);
  } while( true );
}

Assistant:

void MetaCommand::ListOptionsSimplified()
{
  OptionVector::const_iterator it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    if(!(*it).required)
      {
      METAIO_STREAM::cout << "   [ ";
      }
    else
      {
      METAIO_STREAM::cout << "   ";
      }
      if (!(*it).tag.empty()) {
        METAIO_STREAM::cout << "-" << (*it).tag.c_str() << " ";
      }
      auto itField = (*it).fields.begin();
      while (itField != (*it).fields.end()) {
        if ((*itField).type != FLAG) // only display the type if it's not a FLAG
        {
          if ((*itField).required) {
            METAIO_STREAM::cout << "<";
          }
        else
          {
          METAIO_STREAM::cout << "[";
          }

        METAIO_STREAM::cout << (*itField).name.c_str();

        if((*itField).required)
          {
          METAIO_STREAM::cout << "> ";
          }
        else
          {
          METAIO_STREAM::cout << "] ";
          }

        }
      ++itField;
      }

    if(!(*it).required)
      {
      METAIO_STREAM::cout << "]";
      }
    METAIO_STREAM::cout << METAIO_STREAM::endl;

    if (!(*it).description.empty()) {
      METAIO_STREAM::cout << "      = " << (*it).description.c_str();
      METAIO_STREAM::cout << METAIO_STREAM::endl;
      itField = (*it).fields.begin();
      while(itField != (*it).fields.end())
        {
        if (!(*itField).description.empty() || !(*itField).value.empty()) {
          METAIO_STREAM::cout << "        With: " << (*itField).name.c_str();
          if (!(*itField).description.empty()) {
            METAIO_STREAM::cout << " = " << (*itField).description.c_str();
          }
          if (!(*itField).value.empty()) {
            METAIO_STREAM::cout << " (Default = " << (*itField).value << ")";
          }
          METAIO_STREAM::cout << METAIO_STREAM::endl;
        }
        ++itField;
        }
    }

    METAIO_STREAM::cout << METAIO_STREAM::endl;
    ++it;
    }

    if (m_HelpCallBack != nullptr) {
      m_HelpCallBack();
    }
}